

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.c
# Opt level: O0

BOOL pattern_range(char *pattern,int which,PatternRange *range)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *p2;
  char *p;
  PatternRange *range_local;
  int which_local;
  char *pattern_local;
  
  p2 = pattern;
  range_local._4_4_ = which;
  do {
    if (*p2 == '\0') {
      return FALSE;
    }
    while( true ) {
      pcVar2 = p2;
      bVar3 = false;
      if ((*p2 != '\0') && (bVar3 = true, *p2 != '0')) {
        bVar3 = *p2 == '1';
      }
      if (!bVar3) break;
      p2 = p2 + 1;
    }
    iVar1 = (int)p2;
    range->index = iVar1 - (int)pattern;
    while( true ) {
      bVar3 = false;
      if (*p2 != '\0') {
        bVar3 = *p2 == *pcVar2;
      }
      if (!bVar3) break;
      p2 = p2 + 1;
    }
    range->length = (int)p2 - iVar1;
    range_local._4_4_ = range_local._4_4_ + -1;
  } while (0 < range_local._4_4_);
  return TRUE;
}

Assistant:

BOOL
pattern_range (const char *pattern, int which, PatternRange *range)
{
  const char *p = pattern, *p2;

  do
    {
      if (*p == '\0')
	return FALSE;

      /* Skip to first sequence. */
      for (; *p != '\0' && (*p == '0' || *p == '1'); p++)
	;

      /* Remember where the pattern started. */
      range->index = p - pattern;
      p2 = p;

      /* Find the end of the sequence. */
      for (; *p != '\0' && *p == *p2; p++)
	;

      /* Remember the length of the pattern. */
      range->length = p - p2;
    }
  while (--which > 0);

  return TRUE;
}